

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3f __thiscall pbrt::DirectionCone::ClosestVectorInCone(DirectionCone *this,Vector3f wp)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [60];
  undefined1 auVar8 [64];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector3<float> VVar18;
  Vector3<float> VVar19;
  Vector3f VVar20;
  Tuple3<pbrt::Vector3,_float> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  
  auVar9 = wp._12_60_;
  local_48.z = wp.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wp._8_56_;
  auVar6._0_8_ = wp.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_48._0_8_ = vmovlps_avx(auVar6._0_16_);
  VVar18 = Normalize<float>((Vector3<float> *)&local_48);
  auVar8._0_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._4_60_ = auVar9;
  auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar6._8_56_;
  auVar5 = auVar7._0_16_;
  local_48._0_8_ = vmovlps_avx(auVar5);
  auVar11 = vmovshdup_avx(auVar5);
  fVar1 = this->cosTheta;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ *
                                          (this->w).super_Tuple3<pbrt::Vector3,_float>.y)),auVar5,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar11 = vfmadd231ss_fma(auVar11,auVar8._0_16_,
                            ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.z));
  if (auVar11._0_4_ <= fVar1) {
    auVar11 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416(0x3f800000));
    auVar11 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    local_28 = vxorps_avx512vl(auVar11,auVar5);
    auVar7._0_8_ = local_28._8_8_;
    local_48.z = auVar8._0_4_;
    VVar18 = Cross<float>((Vector3<float> *)&local_48,&this->w);
    local_38 = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    uStack_30 = auVar7._0_8_;
    VVar19 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,float> *)this,this->cosTheta);
    auVar4._8_8_ = uStack_30;
    auVar4._0_8_ = local_38;
    fVar1 = (this->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar2._0_4_ = (this->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar2._4_4_ = (this->w).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar2;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = local_48.x;
    auVar16._4_4_ = local_48.y;
    auVar11._0_4_ = (float)local_38 * (float)local_38;
    fVar3 = (float)((ulong)local_38 >> 0x20);
    auVar11._4_4_ = fVar3 * fVar3;
    auVar11._8_4_ = (float)uStack_30 * (float)uStack_30;
    fVar3 = (float)((ulong)uStack_30 >> 0x20);
    auVar11._12_4_ = fVar3 * fVar3;
    fVar3 = fVar1 * fVar1;
    auVar17._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
    auVar17._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
    auVar17._8_8_ = 0;
    auVar11 = vmovshdup_avx(auVar11);
    auVar5 = vshufps_avx(auVar17,auVar17,0xe1);
    auVar11 = vfmadd231ss_fma(auVar11,auVar4,auVar4);
    auVar14._0_4_ = local_48.x * (auVar5._0_4_ + fVar3);
    auVar14._4_4_ = local_48.y * (auVar5._4_4_ + fVar3);
    auVar14._8_4_ = (auVar5._8_4_ + fVar3) * 0.0;
    auVar14._12_4_ = (auVar5._12_4_ + fVar3) * 0.0;
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)VVar18.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)VVar18.super_Tuple3<pbrt::Vector3,_float>.z));
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar10 = (float)local_28._0_4_ / auVar11._0_4_;
    fVar3 = local_48.z * fVar1;
    auVar12._4_4_ = fVar3;
    auVar12._0_4_ = fVar3;
    auVar12._8_4_ = fVar3;
    auVar12._12_4_ = fVar3;
    auVar11 = vfmadd231ps_fma(auVar12,auVar16,auVar15);
    auVar11 = vshufps_avx(auVar11,auVar11,0xe1);
    auVar4 = vfmsub231ps_fma(auVar14,auVar15,auVar11);
    auVar13._0_4_ = local_48.x * (float)(undefined4)uVar2;
    auVar13._4_4_ = local_48.y * (float)uVar2._4_4_;
    auVar13._8_8_ = 0;
    auVar11 = vmovshdup_avx(auVar13);
    auVar5 = vfmadd231ss_fma(auVar11,auVar16,auVar15);
    auVar11 = vhaddps_avx(auVar17,auVar17);
    auVar11 = vfmsub231ss_fma(ZEXT416((uint)(auVar11._0_4_ * local_48.z)),ZEXT416((uint)fVar1),
                              auVar5);
    auVar7._0_8_ = CONCAT44(VVar19.super_Tuple3<pbrt::Vector3,_float>.y + fVar10 * auVar4._4_4_,
                            VVar19.super_Tuple3<pbrt::Vector3,_float>.x + fVar10 * auVar4._0_4_);
    auVar8 = ZEXT464((uint)(VVar19.super_Tuple3<pbrt::Vector3,_float>.z + fVar10 * auVar11._0_4_));
  }
  VVar20.super_Tuple3<pbrt::Vector3,_float>.z = auVar8._0_4_;
  VVar20.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar7._0_8_;
  VVar20.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  return (Vector3f)VVar20.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

DirectionCone::ClosestVectorInCone(Vector3f wp) const {
    DCHECK(!empty);
    wp = Normalize(wp);
    // Return provided vector if it is inside the cone
    if (Dot(wp, w) > cosTheta)
        return wp;

    // Find closest vector by rotating _wp_ until it touches the cone
    Float sinTheta = -SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f a = Cross(wp, w);
    return cosTheta * w +
           (sinTheta / Length(a)) *
               Vector3f(w.x * (wp.y * w.y + wp.z * w.z) - wp.x * (Sqr(w.y) + Sqr(w.z)),
                        w.y * (wp.x * w.x + wp.z * w.z) - wp.y * (Sqr(w.x) + Sqr(w.z)),
                        w.z * (wp.x * w.x + wp.y * w.y) - wp.z * (Sqr(w.x) + Sqr(w.y)));
}